

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O2

void __thiscall OpenMD::DataHolder::DataHolder(DataHolder *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_DataHolder = (_func_int **)&PTR__DataHolder_002bc8d8;
  p_Var1 = &(this->parameters_)._M_t._M_impl.super__Rb_tree_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->parameters_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header;
  (this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

DataHolder() {}